

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_filter.hpp
# Opt level: O1

bool __thiscall
jsoncons::
json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
::visit_string(json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
               *this,string_view_type *value,semantic_tag tag,ser_context *context,error_code *ec)

{
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *pjVar1;
  system_error *this_00;
  type tVar2;
  error_code __ec;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> target;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_48;
  error_code local_40;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = L'\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  tVar2 = unicode_traits::convert<char,std::__cxx11::wstring>
                    (value->_M_str,value->_M_len,&local_70,strict);
  if (tVar2.ec == success) {
    pjVar1 = (this->
             super_json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
             ).destination1_;
    local_50 = local_70._M_string_length;
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                *)local_70._M_dataplus._M_p;
    (*(pjVar1->super_basic_json_visitor<wchar_t>)._vptr_basic_json_visitor[0xc])
              (pjVar1,&local_50,(ulong)tag,context,ec);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT44(local_70.field_2._M_local_buf[1],local_70.field_2._M_local_buf[0]) *
                      4 + 4);
    }
    return true;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::unicode_traits::conv_errc,void>(&local_40,tVar2.ec);
  __ec._4_4_ = 0;
  __ec._M_value = local_40._M_value;
  *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b58738;
  __ec._M_cat = local_40._M_cat;
  std::system_error::system_error(this_00,__ec);
  *(undefined8 *)this_00 = 0xb586d8;
  *(undefined8 *)(this_00 + 0x50) = 0xb58710;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(undefined8 *)(this_00 + 0x28) = 0;
  *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
  *(undefined8 *)(this_00 + 0x38) = 0;
  this_00[0x40] = (system_error)0x0;
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& value,
        semantic_tag tag,
        const ser_context& context,
        std::error_code& ec) override
    {
        std::basic_string<typename To::char_type> target;
        auto result = unicode_traits::convert(value.data(), value.size(),
                                              target,unicode_traits::conv_flags::strict);
        if (result.ec != unicode_traits::conv_errc())
        {
            JSONCONS_THROW(ser_error(result.ec));
        }
        return destination().string_value(target, tag, context, ec);
    }